

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

bool __thiscall TPZMHMeshControl::IsSibling(TPZMHMeshControl *this,int64_t son,int64_t father)

{
  TPZGeoEl **ppTVar1;
  TPZGeoEl *this_00;
  
  ppTVar1 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(((this->fGMesh).fRef)->fPointer->fElementVec).
                        super_TPZChunkVector<TPZGeoEl_*,_10>,son);
  for (this_00 = *ppTVar1; (this_00 != (TPZGeoEl *)0x0 && (this_00->fIndex != father));
      this_00 = TPZGeoEl::Father(this_00)) {
  }
  return this_00 != (TPZGeoEl *)0x0;
}

Assistant:

bool TPZMHMeshControl::IsSibling(int64_t son, int64_t father)
{
    TPZGeoEl *gel = fGMesh->ElementVec()[son];
    while (gel && gel->Index() != father) {
        gel = gel->Father();
    }
    if (gel) {
        return true;
    }
    else
    {
        return false;
    }
}